

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_transcode.cpp
# Opt level: O1

void __thiscall ktx::CommandTranscode::executeTranscode(CommandTranscode *this)

{
  Reporter *report;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined8 stream;
  char cVar4;
  int iVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 testrun;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  size_type __rlen;
  string_view fmt;
  format_args args;
  KTXTexture2 texture;
  OutputStream outputFile;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  path outputPath;
  string writerScParams;
  string writer;
  InputStream inputStream;
  KTXTexture2 local_4c0;
  path local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  undefined1 local_470 [32];
  bool local_450;
  path local_448;
  long *local_420;
  long local_418;
  long local_410 [2];
  string local_400;
  undefined1 local_3e0 [952];
  
  report = &(this->super_Command).super_Reporter;
  InputStream::InputStream
            ((InputStream *)local_3e0,&(this->options).super_OptionsSingleInSingleOut.inputFilepath,
             report);
  stream = local_3e0._32_8_;
  pcVar2 = (this->options).super_OptionsSingleInSingleOut.inputFilepath._M_dataplus._M_p;
  sVar3 = (this->options).super_OptionsSingleInSingleOut.inputFilepath._M_string_length;
  if (sVar3 == 1) {
    iVar5 = bcmp(pcVar2,"-",1);
    if (iVar5 == 0) {
      local_470._0_8_ = local_470 + 0x10;
      local_470._16_4_ = 0x69647473;
      local_470._20_2_ = 0x6e;
      local_470._8_8_ = (basic_streambuf<char,_std::char_traits<char>_> *)0x5;
      goto LAB_001a416d;
    }
  }
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,pcVar2,pcVar2 + sVar3);
LAB_001a416d:
  validateToolInput((istream *)stream,(string *)local_470,report);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,
                    CONCAT26(local_470._22_2_,CONCAT24(local_470._20_2_,local_470._16_4_)) + 1);
  }
  local_4c0.handle_ = (ktxTexture2 *)0x0;
  local_470._8_8_ =
       *(undefined8 *)(local_3e0._32_8_ + *(long *)(*(long *)local_3e0._32_8_ + -0x18) + 0xe8);
  local_470._0_8_ = &PTR__StreambufStream_0025f618;
  local_470._16_4_ = 0xc;
  local_470._24_8_ = operator_new(0x68);
  *(undefined8 *)(local_470._24_8_ + 0x50) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x58) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x40) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x48) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x30) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x38) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x20) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x28) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x10) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x18) = 0;
  *(undefined8 *)local_470._24_8_ = 0;
  *(undefined8 *)(local_470._24_8_ + 8) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x60) = 0;
  local_450 = false;
  *(undefined4 *)(local_470._24_8_ + 0x38) = 3;
  *(undefined1 *)(local_470._24_8_ + 0x60) = 0;
  *(string **)(local_470._24_8_ + 0x40) = (string *)local_470;
  *(undefined8 *)(local_470._24_8_ + 0x48) = 0;
  *(undefined8 *)(local_470._24_8_ + 0x50) = 0;
  *(code **)local_470._24_8_ =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::read;
  *(code **)(local_470._24_8_ + 8) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::skip;
  *(code **)(local_470._24_8_ + 0x10) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::write;
  *(code **)(local_470._24_8_ + 0x18) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getpos;
  *(code **)(local_470._24_8_ + 0x20) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::setpos;
  *(code **)(local_470._24_8_ + 0x28) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getsize;
  *(code **)(local_470._24_8_ + 0x30) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::destruct;
  iVar5 = ktxTexture2_CreateFromStream(local_470._24_8_,1,&local_4c0);
  if (iVar5 != 0) {
    local_448._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar5);
    Reporter::fatal<char_const(&)[34],char_const*>
              (report,INVALID_FILE,(char (*) [34])"Failed to create KTX2 texture: {}",
               (char **)&local_448);
  }
  cVar4 = ktxTexture2_NeedsTranscoding(local_4c0.handle_);
  if (cVar4 == '\0') {
    Reporter::fatal<char_const(&)[30]>(report,INVALID_FILE,(char (*) [30])0x20e4f0);
  }
  transcode<true>((ktx *)&local_448,&local_4c0,&(this->options).super_OptionsTranscodeTarget<true>,
                  report);
  local_4c0.handle_ = (ktxTexture2 *)local_448._M_pathname._M_dataplus._M_p;
  testrun = extraout_DL;
  if ((this->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar5 = ktxTexture2_DeflateZstd
                      (local_448._M_pathname._M_dataplus._M_p,
                       (this->options).super_OptionsDeflate.zstd.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    testrun = extraout_DL_00;
    if (iVar5 != 0) {
      local_448._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar5);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,DFD_FAILURE,(char (*) [37])"Zstd deflation failed. KTX Error: {}",
                 (char **)&local_448);
      testrun = extraout_DL_01;
    }
  }
  if ((this->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar5 = ktxTexture2_DeflateZLIB
                      (local_4c0.handle_,
                       (this->options).super_OptionsDeflate.zlib.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    testrun = extraout_DL_02;
    if (iVar5 != 0) {
      local_448._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar5);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,DFD_FAILURE,(char (*) [37])"ZLIB deflation failed. KTX Error: {}",
                 (char **)&local_448);
      testrun = extraout_DL_03;
    }
  }
  version_abi_cxx11_(&local_4b8._M_pathname,
                     (ktx *)(ulong)(this->options).super_OptionsGeneric.testrun,(bool)testrun);
  local_448._M_pathname._M_dataplus._M_p =
       (this->super_Command).super_Reporter.commandName._M_dataplus._M_p;
  local_448._M_pathname._M_string_length =
       (this->super_Command).super_Reporter.commandName._M_string_length;
  local_448._M_pathname.field_2._M_allocated_capacity =
       (size_type)local_4b8._M_pathname._M_dataplus._M_p;
  local_448._M_pathname.field_2._8_8_ = local_4b8._M_pathname._M_string_length;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x5;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_448;
  ::fmt::v10::vformat_abi_cxx11_(&local_400,(v10 *)0x208eb9,fmt,args);
  paVar1 = &local_4b8._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b8._M_pathname._M_dataplus._M_p,
                    local_4b8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  ktxHashList_DeleteKVPair(&(local_4c0.handle_)->kvDataHead,"KTXwriter");
  ktxHashList_AddKVPair
            (&(local_4c0.handle_)->kvDataHead,"KTXwriter",(int)local_400._M_string_length + 1,
             local_400._M_dataplus._M_p);
  pcVar2 = (this->options).super_OptionsDeflate.compressOptions._M_dataplus._M_p;
  local_420 = local_410;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,pcVar2,
             pcVar2 + (this->options).super_OptionsDeflate.compressOptions._M_string_length);
  ktxHashList_DeleteKVPair(&(local_4c0.handle_)->kvDataHead,"KTXwriterScParams");
  if (local_418 != 0) {
    if ((char)*local_420 != ' ') {
      __assert_fail("writerScParams[0] == \' \'",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_transcode.cpp"
                    ,0xb4,"void ktx::CommandTranscode::executeTranscode()");
    }
    ktxHashList_AddKVPair
              (&(local_4c0.handle_)->kvDataHead,"KTXwriterScParams",local_418,
               (char *)((long)local_420 + 1));
  }
  pcVar2 = (this->options).super_OptionsSingleInSingleOut.outputFilepath._M_dataplus._M_p;
  local_490 = &local_480;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_490,pcVar2,
             pcVar2 + (this->options).super_OptionsSingleInSingleOut.outputFilepath._M_string_length
            );
  if (local_490 == &local_480) {
    local_4b8._M_pathname.field_2._8_8_ = local_480._8_8_;
    local_4b8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_4b8._M_pathname._M_dataplus._M_p = (pointer)local_490;
  }
  local_4b8._M_pathname.field_2._M_allocated_capacity._1_7_ = local_480._M_allocated_capacity._1_7_;
  local_4b8._M_pathname.field_2._M_local_buf[0] = local_480._M_local_buf[0];
  local_4b8._M_pathname._M_string_length = local_488;
  local_488 = 0;
  local_480._M_local_buf[0] = '\0';
  local_490 = &local_480;
  std::filesystem::__cxx11::path::path(&local_448,&local_4b8._M_pathname,auto_format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b8._M_pathname._M_dataplus._M_p,
                    local_4b8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490,
                    CONCAT71(local_480._M_allocated_capacity._1_7_,local_480._M_local_buf[0]) + 1);
  }
  cVar4 = std::filesystem::__cxx11::path::has_parent_path();
  if (cVar4 != '\0') {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories(&local_4b8);
    std::filesystem::__cxx11::path::~path(&local_4b8);
  }
  OutputStream::OutputStream
            ((OutputStream *)&local_4b8,
             &(this->options).super_OptionsSingleInSingleOut.outputFilepath,report);
  OutputStream::writeKTX2((OutputStream *)&local_4b8,(ktxTexture *)local_4c0.handle_,report);
  OutputStream::~OutputStream((OutputStream *)&local_4b8);
  std::filesystem::__cxx11::path::~path(&local_448);
  if (local_420 != local_410) {
    operator_delete(local_420,local_410[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
            ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)local_470);
  if (local_4c0.handle_ != (ktxTexture2 *)0x0) {
    (*(local_4c0.handle_)->vtbl->Destroy)((ktxTexture *)local_4c0.handle_);
    local_4c0.handle_ = (ktxTexture2 *)0x0;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_3e0 + 0x230));
  std::ios_base::~ios_base((ios_base *)(local_3e0 + 0x2b0));
  std::ifstream::~ifstream(local_3e0 + 0x28);
  if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
    operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
  }
  return;
}

Assistant:

void CommandTranscode::executeTranscode() {
    InputStream inputStream(options.inputFilepath, *this);
    validateToolInput(inputStream, fmtInFile(options.inputFilepath), *this);

    KTXTexture2 texture{nullptr};
    StreambufStream<std::streambuf*> ktx2Stream{inputStream->rdbuf(), std::ios::in | std::ios::binary};
    auto ret = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    if (ret != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to create KTX2 texture: {}", ktxErrorString(ret));

    if (!ktxTexture2_NeedsTranscoding(texture))
        fatal(rc::INVALID_FILE, "KTX file is not transcodable.");

    texture = transcode(std::move(texture), options, *this);

    if (options.zstd) {
        ret = ktxTexture2_DeflateZstd(texture, *options.zstd);
        if (ret != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "Zstd deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    if (options.zlib) {
        ret = ktxTexture2_DeflateZLIB(texture, *options.zlib);
        if (ret != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "ZLIB deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    // Modify KTXwriter metadata
    const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
    ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_KEY);
    ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
            static_cast<uint32_t>(writer.size() + 1), // +1 to include the \0
            writer.c_str());

    // Add KTXwriterScParams metadata if supercompression was used
    const auto writerScParams = options.compressOptions;
    ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY);
    if (writerScParams.size() > 0) {
        // Options always contain a leading space
        assert(writerScParams[0] == ' ');
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY,
            static_cast<uint32_t>(writerScParams.size()),
            writerScParams.c_str() + 1); // +1 to exclude leading space
    }

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}